

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateSurfaceTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_4::checkEGLPlatformSupport(Library *egl,char *platformExt)

{
  bool bVar1;
  NotSupportedError *this;
  Library *in_RDX;
  allocator<char> local_99;
  char *platformExt_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  platformExt_local = platformExt;
  eglu::getClientExtensions_abi_cxx11_(&extensions,(eglu *)egl,in_RDX);
  local_70._M_dataplus._M_p =
       (pointer)extensions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_90._M_dataplus._M_p =
       (pointer)extensions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  bVar1 = de::
          contains<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char_const*>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_70,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_90,&platformExt_local);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&extensions);
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Platform extension \'",&local_99);
  std::operator+(&local_90,&local_38,platformExt_local);
  std::operator+(&local_70,&local_90,"\' not supported");
  tcu::NotSupportedError::NotSupportedError
            (this,local_70._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
             ,0x3e);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void checkEGLPlatformSupport (const Library& egl, const char* platformExt)
{
	std::vector<std::string> extensions = eglu::getClientExtensions(egl);

	if (!de::contains(extensions.begin(), extensions.end(), platformExt))
		throw tcu::NotSupportedError((std::string("Platform extension '") + platformExt + "' not supported").c_str(), "", __FILE__, __LINE__);
}